

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::CheckerVisitor::checkDuplicateSwitchCases
          (CheckerVisitor *this,SwitchStatement *swtch)

{
  ulong uVar1;
  SwitchCase *pSVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long local_50;
  ulong local_48;
  
  if ((this->effectsOnly == false) && (1 < (int)(swtch->_cases)._size)) {
    local_48 = 1;
    local_50 = 0x10;
    uVar4 = 0;
    do {
      uVar1 = uVar4 + 1;
      uVar5 = local_48;
      lVar6 = local_50;
      if (uVar1 < (swtch->_cases)._size) {
        do {
          pSVar2 = (swtch->_cases)._vals;
          bVar3 = NodeEqualChecker::check
                            ((NodeEqualChecker *)&this->field_0x20,&(pSVar2[uVar4].val)->super_Node,
                             *(Node **)((long)&pSVar2->val + lVar6));
          if (bVar3) {
            report(this,*(Node **)((long)&pSVar2->val + lVar6),0x42);
          }
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + 0x10;
        } while (uVar5 < (swtch->_cases)._size);
      }
      local_48 = local_48 + 1;
      local_50 = local_50 + 0x10;
      uVar4 = uVar1;
    } while ((long)uVar1 < (long)(int)(swtch->_cases)._size + -1);
  }
  return;
}

Assistant:

void CheckerVisitor::checkDuplicateSwitchCases(SwitchStatement *swtch) {

  if (effectsOnly)
    return;

  const auto &cases = swtch->cases();

  for (int32_t i = 0; i < int32_t(cases.size()) - 1; ++i) {
    for (int32_t j = i + 1; j < cases.size(); ++j) {
      const auto &icase = cases[i];
      const auto &jcase = cases[j];

      if (_equalChecker.check(icase.val, jcase.val)) {
        report(jcase.val, DiagnosticsId::DI_DUPLICATE_CASE);
      }
    }
  }
}